

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O2

void cilk_fiber_pool_free_fibers_from_pool
               (cilk_fiber_pool *pool,uint num_to_keep,cilk_fiber *fiber_to_return)

{
  uint uVar1;
  spin_mutex *psVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int i;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  cilk_fiber *fibers_to_free [10];
  undefined8 auStack_88 [11];
  
  psVar2 = pool->lock;
  uVar7 = (ulong)num_to_keep;
  do {
    if (psVar2 != (spin_mutex *)0x0) {
      spin_mutex_lock(pool->lock);
    }
    uVar1 = pool->size;
    lVar5 = 0;
    for (uVar8 = 0;
        (uVar6 = (ulong)uVar1 + lVar5, iVar4 = (int)lVar5, uVar7 < uVar6 && (uVar8 < 10));
        uVar8 = uVar8 + 1) {
      pool->size = (uVar1 - 1) + iVar4;
      auStack_88[uVar8] = pool->fibers[(uVar1 + iVar4) - 1];
      lVar5 = lVar5 + -1;
    }
    bVar3 = uVar6 <= uVar7;
    pool->total = pool->total + iVar4;
    if (fiber_to_return != (cilk_fiber *)0x0 && uVar6 <= uVar7) {
      if (pool->max_size <= (uint)uVar6) {
        __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk_fiber.cpp"
                      ,0x9c,"pool->size < pool->max_size");
      }
      pool->fibers[uVar6 & 0xffffffff] = fiber_to_return;
      pool->size = uVar1 + iVar4 + 1;
      bVar3 = true;
    }
    if (psVar2 != (spin_mutex *)0x0) {
      spin_mutex_unlock(pool->lock);
    }
    for (uVar6 = 0; uVar6 < uVar8; uVar6 = uVar6 + 1) {
      cilk_fiber::deallocate_to_heap((cilk_fiber *)auStack_88[uVar6]);
    }
  } while (!bVar3);
  return;
}

Assistant:

static void cilk_fiber_pool_free_fibers_from_pool(cilk_fiber_pool* pool,
                                                  unsigned num_to_keep,
                                                  cilk_fiber* fiber_to_return)
{
    // Free our own fibers, until we fall below our desired threshold.
    // Each iteration of this loop proceeds in the following stages:
    //   1.  Acquire the pool lock,
    //   2.  Grabs up to B fibers from the pool, stores them into a buffer.
    //   3.  Check if pool is empty enough.  If yes, put the last fiber back,
    //       and remember that we should quit.
    //   4.  Release the pool lock, and actually free any buffered fibers.
    //   5.  Check if we are done and should exit the loop.  Otherwise, try again.
    // 
    const bool need_lock = pool->lock;
    bool last_fiber_returned = false;
    
    do {
        const int B = 10;   // Pull at most this many fibers from the
                            // parent for one lock acquisition.  Make
                            // this value large enough to amortize
                            // against the cost of acquiring and
                            // releasing the lock.
        int num_to_free = 0;
        cilk_fiber* fibers_to_free[B];

        // Stage 1: Grab the lock.
        if (need_lock) {
            spin_mutex_lock(pool->lock);
        }
        
        // Stage 2: Grab up to B fibers to free.
        int fibers_freed = 0;
        while ((pool->size > num_to_keep) && (num_to_free < B)) {
            fibers_to_free[num_to_free++] = pool->fibers[--pool->size];
            fibers_freed++;
        }
        decrement_pool_total(pool, fibers_freed);

        // Stage 3.  Pool is below threshold.  Put extra fiber back.
        if (pool->size <= num_to_keep) {
            // Put the last fiber back into the pool.
            if (fiber_to_return) {
                CILK_ASSERT(pool->size < pool->max_size);
                pool->fibers[pool->size] = fiber_to_return;
                pool->size++;
            }
            last_fiber_returned = true;
        }
        
        // Stage 4: Release the lock, and actually free any fibers
        // buffered.
        if (need_lock) {
            spin_mutex_unlock(pool->lock);
        }

        for (int i = 0; i < num_to_free; ++i) {
            fibers_to_free[i]->deallocate_to_heap();
        }
        
    } while (!last_fiber_returned);
}